

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_ast_t * mpc_ast_add_root(mpc_ast_t *a)

{
  mpc_ast_t *r;
  mpc_ast_t *a_local;
  
  a_local = a;
  if (((a != (mpc_ast_t *)0x0) && (a->children_num != 0)) && (a->children_num != 1)) {
    a_local = mpc_ast_new(">","");
    mpc_ast_add_child(a_local,a);
  }
  return a_local;
}

Assistant:

mpc_ast_t *mpc_ast_add_root(mpc_ast_t *a) {

  mpc_ast_t *r;

  if (a == NULL) { return a; }
  if (a->children_num == 0) { return a; }
  if (a->children_num == 1) { return a; }

  r = mpc_ast_new(">", "");
  mpc_ast_add_child(r, a);
  return r;
}